

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintSmartPointer<qclab::QObject<std::complex<float>>,std::unique_ptr<qclab::QObject<std::complex<float>>,std::default_delete<qclab::QObject<std::complex<float>>>>,void>
               (unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
                *ptr,ostream *os,int param_3)

{
  bool bVar1;
  ostream *poVar2;
  pointer p;
  void *pvVar3;
  type value;
  int param_2_local;
  ostream *os_local;
  unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
  *ptr_local;
  
  bVar1 = std::operator==(ptr,(nullptr_t)0x0);
  if (bVar1) {
    std::operator<<(os,"(nullptr)");
  }
  else {
    poVar2 = std::operator<<(os,"(ptr = ");
    p = std::
        unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
        ::get(ptr);
    pvVar3 = VoidifyPointer(p);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar3);
    std::operator<<(poVar2,", value = ");
    value = std::
            unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
            ::operator*(ptr);
    UniversalPrinter<qclab::QObject<std::complex<float>_>_>::Print(value,os);
    std::operator<<(os,")");
  }
  return;
}

Assistant:

void PrintSmartPointer(const Ptr& ptr, std::ostream* os, int) {
  if (ptr == nullptr) {
    *os << "(nullptr)";
  } else {
    *os << "(ptr = " << (VoidifyPointer)(ptr.get()) << ", value = ";
    UniversalPrinter<T>::Print(*ptr, os);
    *os << ")";
  }
}